

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O1

bool ComputeFilter(BlockFilterType filter_type,CBlockIndex *block_index,BlockFilter *filter,
                  BlockManager *blockman)

{
  bool bVar1;
  long in_FS_OFFSET;
  CBlockUndo block_undo;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CBlock block;
  vector<CTxUndo,_std::allocator<CTxUndo>_> local_138;
  unique_lock<std::recursive_mutex> local_120;
  BlockFilter local_110;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_120._M_device = &cs_main.super_recursive_mutex;
  local_120._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_120);
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super_CBlockHeader.nBits = 0;
  local_a8.super_CBlockHeader.nNonce = 0;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.super_CBlockHeader.nTime = 0;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.super_CBlockHeader.nVersion = 0;
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fChecked = false;
  local_a8.m_checked_witness_commitment = false;
  local_a8.m_checked_merkle_root = false;
  local_110._0_4_ = -(uint)((block_index->nStatus & 8) == 0) | block_index->nFile;
  local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems._3_4_ =
       (int)(block_index->nStatus << 0x1c) >> 0x1f & block_index->nDataPos;
  bVar1 = node::BlockManager::ReadBlockFromDisk(blockman,&local_a8,(FlatFilePos *)&local_110);
  if (bVar1) {
    local_138.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((block_index->nHeight < 1) ||
       (bVar1 = node::BlockManager::UndoReadFromDisk(blockman,(CBlockUndo *)&local_138,block_index),
       bVar1)) {
      BlockFilter::BlockFilter(&local_110,filter_type,&local_a8,(CBlockUndo *)&local_138);
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0xf) =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_;
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0x17) =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_;
      filter->m_filter_type = local_110.m_filter_type;
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[0] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[0];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[1] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[1];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[2] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[2];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[3] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[3];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[4] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[4];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[5] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[5];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[6] =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems[6];
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 7) =
           local_110.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_;
      *(undefined4 *)&(filter->m_filter).m_params.m_siphash_k0 =
           (undefined4)local_110.m_filter.m_params.m_siphash_k0;
      *(undefined4 *)((long)&(filter->m_filter).m_params.m_siphash_k0 + 4) =
           local_110.m_filter.m_params.m_siphash_k0._4_4_;
      *(undefined4 *)&(filter->m_filter).m_params.m_siphash_k1 =
           (undefined4)local_110.m_filter.m_params.m_siphash_k1;
      *(undefined4 *)((long)&(filter->m_filter).m_params.m_siphash_k1 + 4) =
           local_110.m_filter.m_params.m_siphash_k1._4_4_;
      (filter->m_filter).m_params.m_P = local_110.m_filter.m_params.m_P;
      *(undefined3 *)&(filter->m_filter).m_params.field_0x11 = local_110.m_filter.m_params._17_3_;
      (filter->m_filter).m_params.m_M = local_110.m_filter.m_params.m_M;
      (filter->m_filter).m_N = local_110.m_filter.m_N;
      *(undefined4 *)&(filter->m_filter).field_0x1c = local_110.m_filter._28_4_;
      (filter->m_filter).m_F = local_110.m_filter.m_F;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&(filter->m_filter).m_encoded,&local_110.m_filter.m_encoded);
      if (local_110.m_filter.m_encoded.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.m_filter.m_encoded.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.m_filter.m_encoded.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.m_filter.m_encoded.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&local_138);
  }
  else {
    bVar1 = false;
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool ComputeFilter(BlockFilterType filter_type, const CBlockIndex& block_index, BlockFilter& filter, const BlockManager& blockman)
{
    LOCK(::cs_main);

    CBlock block;
    if (!blockman.ReadBlockFromDisk(block, block_index.GetBlockPos())) {
        return false;
    }

    CBlockUndo block_undo;
    if (block_index.nHeight > 0 && !blockman.UndoReadFromDisk(block_undo, block_index)) {
        return false;
    }

    filter = BlockFilter(filter_type, block, block_undo);
    return true;
}